

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

void __thiscall kj::Path::Path(Path *this,Array<kj::String> *partsParam)

{
  size_t sVar1;
  size_t extraout_RDX;
  size_t sVar2;
  size_t extraout_RDX_00;
  Array<kj::String> *__range1;
  Path *this_00;
  String *p;
  String *pSVar3;
  long lVar4;
  StringPtr part;
  Array<kj::String> local_38;
  
  pSVar3 = partsParam->ptr;
  sVar2 = partsParam->size_;
  local_38.disposer = partsParam->disposer;
  partsParam->ptr = (String *)0x0;
  partsParam->size_ = 0;
  (this->parts).ptr = pSVar3;
  (this->parts).size_ = sVar2;
  (this->parts).disposer = local_38.disposer;
  local_38.ptr = (String *)0x0;
  local_38.size_ = 0;
  Array<kj::String>::~Array(&local_38);
  pSVar3 = (this->parts).ptr;
  sVar2 = extraout_RDX;
  for (lVar4 = (this->parts).size_ * 0x18; lVar4 != 0; lVar4 = lVar4 + -0x18) {
    sVar1 = (pSVar3->content).size_;
    this_00 = (Path *)0x4706a1;
    if (sVar1 != 0) {
      this_00 = (Path *)(pSVar3->content).ptr;
    }
    part.content.ptr = (char *)(sVar1 + (sVar1 == 0));
    part.content.size_ = sVar2;
    validatePart(this_00,part);
    pSVar3 = pSVar3 + 1;
    sVar2 = extraout_RDX_00;
  }
  return;
}

Assistant:

Path::Path(Array<String> partsParam)
    : Path(kj::mv(partsParam), ALREADY_CHECKED) {
  for (auto& p: parts) {
    validatePart(p);
  }
}